

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::
allocCallbackFailMultipleObjectsTest<vkt::api::(anonymous_namespace)::CommandBuffer>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  deInt32 *pdVar1;
  pointer pbVar2;
  Context *this;
  ulong uVar3;
  deUint32 dVar4;
  VkResult value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  undefined8 *__s;
  VkAllocationCallbacks *allocator;
  DeviceInterface *vk;
  VkDevice device;
  Move<vk::VkCommandBuffer_s_*> *pMVar6;
  Checked<vk::VkCommandBuffer_s_*> CVar7;
  ulong uVar8;
  undefined8 *puVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  char **value_00;
  int iVar11;
  char *pcVar12;
  undefined8 uVar13;
  undefined1 auVar14 [8];
  long lVar15;
  bool bVar16;
  vector<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
  scopedHandles;
  VkCommandBufferAllocateInfo cmdBufferInfo;
  size_type __dnew;
  DeterministicFailAllocator objAllocator;
  ulong local_310;
  SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_> local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e0;
  string *local_2d8;
  Context *local_2d0;
  undefined1 local_2c8 [16];
  pointer local_2b8;
  string local_2a8;
  Parameters local_288;
  pointer local_280;
  pointer local_278;
  ulong local_270;
  size_t local_268;
  undefined1 local_260 [8];
  _func_int **local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_250;
  undefined8 uStack_240;
  ios_base local_1e8 [264];
  AllocationCallbackRecorder local_e0;
  DeterministicFailAllocator local_80;
  
  local_e0.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks =
       (_func_int **)0x13;
  local_288 = params;
  local_260 = (undefined1  [8])&aStack_250;
  local_260 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_260,(ulong)&local_e0);
  aStack_250._M_allocated_capacity =
       (size_type)
       local_e0.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks;
  *(undefined8 *)local_260 = 0x6d5f52484b5f4b56;
  *(undefined8 *)((long)local_260 + 8) = 0x6e616e65746e6961;
  builtin_strncpy((char *)((long)((long)local_260 + 8) + 7),"nce1",4);
  local_258 = local_e0.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks;
  *(char *)((long)local_e0.super_ChainedAllocator.super_AllocationCallbacks.
                  _vptr_AllocationCallbacks + (long)local_260) = '\0';
  local_2d0 = context;
  pvVar5 = Context::getDeviceExtensions_abi_cxx11_(context);
  pbVar2 = (pvVar5->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = Context::getDeviceExtensions_abi_cxx11_(local_2d0);
  local_278 = (pvVar5->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_280 = (pointer)std::
                       __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                 (pbVar2,local_278,local_260);
  local_270 = (ulong)local_288 >> 0x20;
  if (local_260 != (undefined1  [8])&aStack_250) {
    operator_delete((void *)local_260,aStack_250._M_allocated_capacity + 1);
  }
  __s = (undefined8 *)operator_new(0x20);
  local_2d8 = (string *)&__return_storage_ptr__->m_description;
  local_2e0 = &(__return_storage_ptr__->m_description).field_2;
  puVar9 = __s + 1;
  if (__s + 1 < __s + 4) {
    puVar9 = __s + 4;
  }
  local_268 = (~(ulong)__s + (long)puVar9 & 0xfffffffffffffff8) + 8;
  *__s = 0;
  __s[1] = 0;
  __s[2] = 0;
  __s[3] = 0;
  local_310 = 0;
  do {
    memset(__s,0xde,local_268);
    allocator = ::vk::getSystemAllocator();
    ::vk::DeterministicFailAllocator::DeterministicFailAllocator
              (&local_80,allocator,MODE_DO_NOT_COUNT,0);
    ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
              (&local_e0,&local_80.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks,0x80
              );
    this = local_2d0;
    vk = Context::getDeviceInterface(local_2d0);
    device = Context::getDevice(this);
    dVar4 = Context::getUniversalQueueFamilyIndex(this);
    local_260 = (undefined1  [8])this->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_258,"Trying to create ",0x11);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_258);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258," objects with ",0xe);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_258);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258," allocation",0xb);
    pcVar12 = "";
    if (local_310 != 1) {
      pcVar12 = "s";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_258,pcVar12,(ulong)(local_310 != 1));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258," passing",8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
    std::ios_base::~ios_base(local_1e8);
    local_2c8._0_4_ = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
    local_2c8._8_8_ = (pointer)0x0;
    local_2b8 = (pointer)CONCAT44(dVar4,local_288.commandPool.flags.flags);
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)&local_2a8,vk,device,
               (VkCommandPoolCreateInfo *)local_2c8,
               &local_e0.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks);
    local_258 = (_func_int **)
                CONCAT44(local_2a8._M_dataplus._M_p._4_4_,local_2a8._M_dataplus._M_p._0_4_);
    uStack_240._4_4_ = local_2a8.field_2._12_4_;
    uStack_240._0_4_ = local_2a8.field_2._8_4_;
    aStack_250._8_8_ = local_2a8.field_2._M_allocated_capacity;
    aStack_250._M_allocated_capacity = local_2a8._M_string_length;
    ::vk::DeterministicFailAllocator::reset(&local_80,MODE_COUNT_AND_FAIL,(deUint32)local_310);
    local_2a8._M_dataplus._M_p._0_4_ = 0x28;
    local_2a8._M_string_length = 0;
    local_2a8.field_2._M_allocated_capacity = (size_type)local_258;
    local_2a8.field_2._8_4_ = (undefined4)local_270;
    local_2a8.field_2._12_4_ = 4;
    value = (*vk->_vptr_DeviceInterface[0x47])(vk,device,&local_2a8,__s);
    local_2c8._0_8_ = (pointer)0x0;
    local_2c8._8_8_ = (pointer)0x0;
    local_2b8 = (pointer)0x0;
    if (value == VK_SUCCESS) {
      lVar15 = 0;
      do {
        pMVar6 = (Move<vk::VkCommandBuffer_s_*> *)operator_new(0x20);
        CVar7 = ::vk::refdetails::check<vk::VkCommandBuffer_s*>((VkCommandBuffer_s *)__s[lVar15]);
        (pMVar6->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object = CVar7.object;
        (pMVar6->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_deviceIface = vk;
        (pMVar6->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_device = device;
        (pMVar6->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_pool.m_internal =
             (deUint64)local_258;
        local_2f8.m_state = (SharedPtrStateBase *)0x0;
        local_2f8.m_ptr = pMVar6;
        local_2f8.m_state = (SharedPtrStateBase *)operator_new(0x20);
        (local_2f8.m_state)->strongRefCount = 0;
        (local_2f8.m_state)->weakRefCount = 0;
        (local_2f8.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d539a0;
        local_2f8.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pMVar6;
        (local_2f8.m_state)->strongRefCount = 1;
        (local_2f8.m_state)->weakRefCount = 1;
        std::
        vector<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s*>>,std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s*>>>>
        ::emplace_back<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s*>>>
                  ((vector<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s*>>,std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s*>>>>
                    *)local_2c8,&local_2f8);
        if (local_2f8.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &(local_2f8.m_state)->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_2f8.m_ptr = (Move<vk::VkCommandBuffer_s_*> *)0x0;
            (*(local_2f8.m_state)->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &(local_2f8.m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            if (local_2f8.m_state != (SharedPtrStateBase *)0x0) {
              (*(local_2f8.m_state)->_vptr_SharedPtrStateBase[1])();
            }
            local_2f8.m_state = (SharedPtrStateBase *)0x0;
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
    }
    std::
    vector<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
    ::~vector((vector<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
               *)local_2c8);
    if (local_258 != (_func_int **)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&aStack_250,(VkCommandPool)local_258);
    }
    aStack_250._8_8_ = 0;
    uStack_240 = 0;
    local_258 = (_func_int **)0x0;
    aStack_250._M_allocated_capacity = 0;
    if (value == VK_SUCCESS) {
      local_260 = (undefined1  [8])local_2d0->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_258,"Construction of all objects succeeded! ",0x27);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
      std::ios_base::~ios_base(local_1e8);
      iVar11 = 2;
    }
    else {
      if (local_280 != local_278) {
        iVar11 = 5;
        bVar16 = 3 < local_310;
        if (!bVar16) {
          uVar3 = local_310;
          if (__s[local_310] == 0) {
            do {
              uVar8 = uVar3;
              bVar16 = 2 < uVar8;
              if (uVar8 == 3) goto LAB_0042f641;
              uVar3 = uVar8 + 1;
            } while (__s[uVar8 + 1] == 0);
            bVar16 = 2 < uVar8;
          }
          local_260 = (undefined1  [8])&aStack_250;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_260,"Some object handles weren\'t set to NULL","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_2e0;
          std::__cxx11::string::_M_construct<char*>
                    (local_2d8,local_260,(char *)((long)local_260 + (long)local_258));
          if (local_260 != (undefined1  [8])&aStack_250) {
            operator_delete((void *)local_260,aStack_250._M_allocated_capacity + 1);
          }
          iVar11 = 1;
        }
LAB_0042f641:
        if (!bVar16) goto LAB_0042f883;
      }
      if (value == VK_ERROR_OUT_OF_HOST_MEMORY) {
        bVar16 = ::vk::validateAndLog(local_2d0->m_testCtx->m_log,&local_e0,0);
        iVar11 = 0;
        if (bVar16) goto LAB_0042f883;
        local_260 = (undefined1  [8])&aStack_250;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_260,"Invalid allocation callback","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_2e0;
        std::__cxx11::string::_M_construct<char*>
                  (local_2d8,local_260,(char *)((long)local_260 + (long)local_258));
        uVar13 = aStack_250._M_allocated_capacity;
        auVar14 = local_260;
        if (local_260 != (undefined1  [8])&aStack_250) goto LAB_0042f876;
      }
      else {
        local_2c8._0_8_ = ::vk::getResultName(value);
        de::toString<char_const*>(&local_2a8,(de *)local_2c8,value_00);
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_2a8,0,(char *)0x0,0xafa9e8);
        local_260 = (undefined1  [8])&aStack_250;
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar10) {
          aStack_250._M_allocated_capacity = paVar10->_M_allocated_capacity;
          aStack_250._8_8_ = puVar9[3];
        }
        else {
          aStack_250._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_260 = (undefined1  [8])*puVar9;
        }
        local_258 = (_func_int **)puVar9[1];
        *puVar9 = paVar10;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_2e0;
        std::__cxx11::string::_M_construct<char*>
                  (local_2d8,local_260,(char *)((long)local_260 + (long)local_258));
        if (local_260 != (undefined1  [8])&aStack_250) {
          operator_delete((void *)local_260,aStack_250._M_allocated_capacity + 1);
        }
        auVar14 = (undefined1  [8])
                  CONCAT44(local_2a8._M_dataplus._M_p._4_4_,local_2a8._M_dataplus._M_p._0_4_);
        uVar13 = local_2a8.field_2._M_allocated_capacity;
        if (auVar14 != (undefined1  [8])&local_2a8.field_2) {
LAB_0042f876:
          operator_delete((void *)auVar14,uVar13 + 1);
        }
      }
      iVar11 = 1;
    }
LAB_0042f883:
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_e0);
    ::vk::DeterministicFailAllocator::~DeterministicFailAllocator(&local_80);
    if (iVar11 != 0) {
      if (iVar11 == 2) {
        bVar16 = true;
      }
      else {
        bVar16 = iVar11 == 0;
      }
      goto LAB_0042f8df;
    }
    local_310 = local_310 + 1;
    if (local_310 == 5) {
      bVar16 = true;
      local_310 = 1;
LAB_0042f8df:
      operator_delete(__s,0x20);
      if (bVar16) {
        if ((int)local_310 == 0) {
          local_260 = (undefined1  [8])&aStack_250;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_260,
                     "Not validated: pooled objects didn\'t seem to use host memory","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_2e0;
          std::__cxx11::string::_M_construct<char*>
                    (local_2d8,local_260,(long)local_260 + (long)local_258);
        }
        else {
          local_260 = (undefined1  [8])&aStack_250;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"Ok","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_2e0;
          std::__cxx11::string::_M_construct<char*>
                    (local_2d8,local_260,(long)local_260 + (long)local_258);
        }
        if (local_260 != (undefined1  [8])&aStack_250) {
          operator_delete((void *)local_260,aStack_250._M_allocated_capacity + 1);
        }
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

tcu::TestStatus allocCallbackFailMultipleObjectsTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<Move<typename Object::Type> >	ObjectTypeSp;

	static const deUint32	numObjects			= 4;
	const bool				expectNullHandles	= isNullHandleOnAllocationFailure<typename Object::Type>(context);
	deUint32				numPassingAllocs	= 0;

	{
		vector<typename Object::Type>	handles	(numObjects);
		VkResult						result	= VK_NOT_READY;

		for (; numPassingAllocs <= numObjects; ++numPassingAllocs)
		{
			ValidateQueryBits::fillBits(handles.begin(), handles.end());	// fill with garbage

			// \note We have to use the same allocator for both resource dependencies and the object under test,
			//       because pooled objects take memory from the pool.
			DeterministicFailAllocator			objAllocator(getSystemAllocator(), DeterministicFailAllocator::MODE_DO_NOT_COUNT, 0);
			AllocationCallbackRecorder			recorder	(objAllocator.getCallbacks(), 128);
			const Environment					objEnv		(context.getPlatformInterface(),
															 context.getDeviceInterface(),
															 context.getDevice(),
															 context.getUniversalQueueFamilyIndex(),
															 context.getBinaryCollection(),
															 recorder.getCallbacks(),
															 numObjects);

			context.getTestContext().getLog()
				<< TestLog::Message
				<< "Trying to create " << numObjects << " objects with " << numPassingAllocs << " allocation" << (numPassingAllocs != 1 ? "s" : "") << " passing"
				<< TestLog::EndMessage;

			{
				const typename Object::Resources res (objEnv, params);

				objAllocator.reset(DeterministicFailAllocator::MODE_COUNT_AND_FAIL, numPassingAllocs);
				const vector<ObjectTypeSp> scopedHandles = Object::createMultiple(objEnv, res, params, &handles, &result);
			}

			if (result == VK_SUCCESS)
			{
				context.getTestContext().getLog() << TestLog::Message << "Construction of all objects succeeded! " << TestLog::EndMessage;
				break;
			}
			else
			{
				if (expectNullHandles)
				{
					for (deUint32 nullNdx = numPassingAllocs; nullNdx < numObjects; ++nullNdx)
					{
						if (handles[nullNdx] != DE_NULL)
							return tcu::TestStatus::fail("Some object handles weren't set to NULL");
					}
				}

				if (result != VK_ERROR_OUT_OF_HOST_MEMORY)
					return tcu::TestStatus::fail("Got invalid error code: " + de::toString(getResultName(result)));

				if (!validateAndLog(context.getTestContext().getLog(), recorder, 0u))
					return tcu::TestStatus::fail("Invalid allocation callback");
			}
		}
	}

	if (numPassingAllocs == 0)
	{
		if (isPooledObject<typename Object::Type>())
			return tcu::TestStatus::pass("Not validated: pooled objects didn't seem to use host memory");
		else
			return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks not called");
	}
	else
		return tcu::TestStatus::pass("Ok");
}